

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall SQCompilation::CheckerVisitor::visitClassDecl(CheckerVisitor *this,ClassDecl *klass)

{
  Expr *pEVar1;
  CheckerVisitor *in_RSI;
  value_type *in_RDI;
  uint in_stack_ffffffffffffffe4;
  CheckerVisitor *this_00;
  
  this_00 = in_RSI;
  std::
  vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
  ::push_back((vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
               *)((ulong)in_stack_ffffffffffffffe4 << 0x20),in_RDI);
  pEVar1 = ClassDecl::classKey((ClassDecl *)this_00);
  if (pEVar1 != (Expr *)0x0) {
    ClassDecl::classKey((ClassDecl *)this_00);
    Node::visit<SQCompilation::CheckerVisitor>((Node *)this_00,in_RSI);
  }
  pEVar1 = ClassDecl::classBase((ClassDecl *)this_00);
  if (pEVar1 != (Expr *)0x0) {
    ClassDecl::classBase((ClassDecl *)this_00);
    Node::visit<SQCompilation::CheckerVisitor>((Node *)this_00,in_RSI);
  }
  (**(code **)(*(long *)in_RDI + 0x168))(in_RDI,this_00);
  std::
  vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
  ::pop_back((vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
              *)0x1956f2);
  return;
}

Assistant:

void CheckerVisitor::visitClassDecl(ClassDecl *klass) {
  nodeStack.push_back({ SST_NODE, klass });

  if (klass->classKey())
    klass->classKey()->visit(this);

  if (klass->classBase())
    klass->classBase()->visit(this);

  visitTableDecl(klass);

  nodeStack.pop_back();
}